

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagecodec.hpp
# Opt level: O0

vec4 ImageCodec::decodeFLOAT_SINTVec<signed_char,1>(ImageCodec *param_1,void *ptr)

{
  float fVar1;
  float *pfVar2;
  long in_RSI;
  float i_00;
  int i;
  float upper;
  char *data;
  vec4 result;
  float local_38;
  int iVar3;
  undefined4 uVar4;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3 local_10;
  
  uVar4 = 0x437f0000;
  glm::vec<4,_float,_(glm::precision)0>::vec
            ((vec<4,_float,_(glm::precision)0> *)&local_10.field_0,0.0,0.0,0.0,1.0);
  for (iVar3 = 0; iVar3 < 1; iVar3 = iVar3 + 1) {
    i_00 = (float)(int)*(char *)(in_RSI + iVar3) / 255.0;
    local_38 = -1.0;
    pfVar2 = std::max<float>((float *)&stack0xffffffffffffffcc,&local_38);
    fVar1 = *pfVar2;
    pfVar2 = glm::vec<4,_float,_(glm::precision)0>::operator[]
                       ((vec<4,_float,_(glm::precision)0> *)CONCAT44(uVar4,iVar3),(length_type)i_00)
    ;
    *pfVar2 = fVar1;
  }
  return (anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3)
         (anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3)local_10.field_0;
}

Assistant:

static glm::vec4 decodeFLOAT_SINTVec(const ImageCodec*, const void* ptr) {
        static_assert(std::is_signed_v<TYPE>);
        static_assert((COMPONENTS > 0) && (COMPONENTS <= 4));
        auto data = reinterpret_cast<const TYPE*>(ptr);
        const auto upper = static_cast<float>((128u << sizeof(TYPE)) - 1u);
        glm::vec4 result(0.f, 0.f, 0.f, 1.f);
        for (int i = 0; i < COMPONENTS; ++i)
            result[i] = std::max(static_cast<float>(data[i]) / upper, -1.f);
        return result;
    }